

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

bool __thiscall ON_NurbsSurface::IsNatural(ON_NurbsSurface *this,int dir,int end)

{
  bool bVar1;
  double *pdVar2;
  size_t parameter_count;
  double dVar3;
  double parameter_list [2];
  ON_Interval domain;
  double local_48;
  double local_40;
  ON_Interval local_38;
  
  if (2 < (uint)end || 1 < (uint)dir) {
    return false;
  }
  pdVar2 = &local_48;
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])();
  local_48 = ON_DBL_QNAN;
  local_40 = ON_DBL_QNAN;
  if ((end & 1U) == 0) {
    local_48 = ON_Interval::operator[](&local_38,0);
    parameter_count = 1;
    if (1 < end - 1U) goto LAB_00547102;
    pdVar2 = &local_40;
    parameter_count = 2;
  }
  else {
    parameter_count = 1;
  }
  dVar3 = ON_Interval::operator[](&local_38,1);
  *pdVar2 = dVar3;
LAB_00547102:
  bVar1 = IsNatural(this,dir,parameter_count,&local_48);
  return bVar1;
}

Assistant:

bool ON_NurbsSurface::IsNatural(int dir, int end) const
{
  if (dir < 0 || dir > 1 || end < 0 || end > 2)
    return false;

  const ON_Interval domain = Domain(dir);
  size_t parameter_count = 0;
  double parameter_list[2] = {ON_DBL_QNAN,ON_DBL_QNAN};
  if (0 == end || 2 == end)
    parameter_list[parameter_count++] = domain[0];
  if (1 == end || 2 == end)
    parameter_list[parameter_count++] = domain[1];
  return ON_NurbsSurface::IsNatural(dir, parameter_count, parameter_list);
}